

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::enum_<anurbs::TrimTypes>::enum_<>(enum_<anurbs::TrimTypes> *this,handle *scope,char *name)

{
  str_attr_accessor local_88;
  is_method local_68;
  type local_59;
  cpp_function local_58;
  cpp_function setstate;
  anon_class_1_0_00000001 local_48;
  factory<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_pybind11_h:1564:18),_pybind11::detail::void_type_(*)(),_anurbs::TrimTypes_(unsigned_int),_pybind11::detail::void_type_()>
  local_47;
  undefined1 local_46;
  undefined1 local_45;
  bool is_convertible;
  bool is_arithmetic;
  PyObject *local_38;
  PyObject *local_30;
  PyObject *local_28;
  char *local_20;
  char *name_local;
  handle *scope_local;
  enum_<anurbs::TrimTypes> *this_local;
  
  local_28 = scope->m_ptr;
  local_20 = name;
  name_local = (char *)scope;
  scope_local = (handle *)this;
  class_<anurbs::TrimTypes>::class_<>(&this->super_class_<anurbs::TrimTypes>,(handle)local_28,name);
  local_30 = (this->super_class_<anurbs::TrimTypes>).super_generic_type.super_object.super_handle.
             m_ptr;
  local_38 = *(PyObject **)name_local;
  detail::enum_base::enum_base(&this->m_base,(handle)local_30,(handle)local_38);
  local_45 = 0;
  local_46 = 1;
  detail::enum_base::init(&this->m_base,(EVP_PKEY_CTX *)0x0);
  init<pybind11::enum_<anurbs::TrimTypes>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(unsigned_int)_1_,pybind11::detail::initimpl::factory<pybind11::enum_<anurbs::TrimTypes>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(unsigned_int)_1_,pybind11::detail::void_type(*)(),anurbs::TrimTypes(unsigned_int),pybind11::detail::void_type()>>
            (&local_48);
  class_<anurbs::TrimTypes>::
  def<pybind11::enum_<anurbs::TrimTypes>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(unsigned_int)_1_,pybind11::detail::void_type(*)(),anurbs::TrimTypes(unsigned_int),pybind11::detail::void_type()>
            (&this->super_class_<anurbs::TrimTypes>,&local_47);
  class_<anurbs::TrimTypes>::
  def<pybind11::enum_<anurbs::TrimTypes>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(anurbs::TrimTypes)_1_>
            (&this->super_class_<anurbs::TrimTypes>,"__int__",
             (type *)((long)&setstate.super_function.super_object.super_handle.m_ptr + 6));
  class_<anurbs::TrimTypes>::
  def<pybind11::enum_<anurbs::TrimTypes>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(anurbs::TrimTypes)_2_>
            (&this->super_class_<anurbs::TrimTypes>,"__index__",
             (type *)((long)&setstate.super_function.super_object.super_handle.m_ptr + 5));
  is_method::is_method(&local_68,(handle *)this);
  cpp_function::
  cpp_function<pybind11::enum_<anurbs::TrimTypes>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(anurbs::TrimTypes&,unsigned_int)_1_,pybind11::is_method,void>
            (&local_58,&local_59,&local_68);
  detail::object_api<pybind11::handle>::attr
            (&local_88,(object_api<pybind11::handle> *)this,"__setstate__");
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_88,&local_58);
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_88);
  cpp_function::~cpp_function(&local_58);
  return;
}

Assistant:

enum_(const handle &scope, const char *name, const Extra&... extra)
      : class_<Type>(scope, name, extra...), m_base(*this, scope) {
        constexpr bool is_arithmetic = detail::any_of<std::is_same<arithmetic, Extra>...>::value;
        constexpr bool is_convertible = std::is_convertible<Type, Scalar>::value;
        m_base.init(is_arithmetic, is_convertible);

        def(init([](Scalar i) { return static_cast<Type>(i); }));
        def("__int__", [](Type value) { return (Scalar) value; });
        #if PY_MAJOR_VERSION < 3
            def("__long__", [](Type value) { return (Scalar) value; });
        #endif
        #if PY_MAJOR_VERSION > 3 || (PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION >= 8)
            def("__index__", [](Type value) { return (Scalar) value; });
        #endif

        cpp_function setstate(
            [](Type &value, Scalar arg) { value = static_cast<Type>(arg); },
            is_method(*this));
        attr("__setstate__") = setstate;
    }